

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::FunctionStatement(SQCompiler *this)

{
  SQFuncState *pSVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQObject SVar4;
  SQObject local_40;
  
  Lex(this);
  SVar4 = Expect(this,0x102);
  local_40._unVal = SVar4._unVal;
  local_40._type = SVar4._type;
  SQFuncState::PushTarget(this->_fs,0);
  pSVar1 = this->_fs;
  SVar2 = SQFuncState::PushTarget(pSVar1,-1);
  SVar3 = SQFuncState::GetConstant(this->_fs,&local_40);
  SQFuncState::AddInstruction(pSVar1,_OP_LOAD,SVar2,SVar3,0,0);
  if (this->_token != 299) goto LAB_0011c3db;
  do {
    Emit2ArgsOP(this,_OP_GET,0);
LAB_0011c3db:
    do {
      if (this->_token != 299) {
        Expect(this,0x28);
        CreateFunction(this,&local_40,false);
        pSVar1 = this->_fs;
        SVar2 = SQFuncState::PushTarget(pSVar1,-1);
        SQFuncState::AddInstruction(pSVar1,_OP_CLOSURE,SVar2,(this->_fs->_functions)._size - 1,0,0);
        EmitDerefOp(this,_OP_NEWSLOT);
        SQFuncState::PopTarget(this->_fs);
        return;
      }
      Lex(this);
      SVar4 = Expect(this,0x102);
      local_40._unVal = SVar4._unVal;
      local_40._type = SVar4._type;
      pSVar1 = this->_fs;
      SVar2 = SQFuncState::PushTarget(pSVar1,-1);
      SVar3 = SQFuncState::GetConstant(this->_fs,&local_40);
      SQFuncState::AddInstruction(pSVar1,_OP_LOAD,SVar2,SVar3,0,0);
    } while (this->_token != 299);
  } while( true );
}

Assistant:

void FunctionStatement()
    {
        SQObject id;
        Lex(); id = Expect(TK_IDENTIFIER);
        _fs->PushTarget(0);
        _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
        if(_token == TK_DOUBLE_COLON) Emit2ArgsOP(_OP_GET);

        while(_token == TK_DOUBLE_COLON) {
            Lex();
            id = Expect(TK_IDENTIFIER);
            _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(id));
            if(_token == TK_DOUBLE_COLON) Emit2ArgsOP(_OP_GET);
        }
        Expect(_SC('('));
        CreateFunction(id);
        _fs->AddInstruction(_OP_CLOSURE, _fs->PushTarget(), _fs->_functions.size() - 1, 0);
        EmitDerefOp(_OP_NEWSLOT);
        _fs->PopTarget();
    }